

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.c
# Opt level: O0

int cf_gcm_decrypt(cf_prp *prp,void *prpctx,uint8_t *cipher,size_t ncipher,uint8_t *header,
                  size_t nheader,uint8_t *nonce,size_t nnonce,uint8_t *tag,size_t ntag,
                  uint8_t *plain)

{
  uint uVar1;
  uint local_16c;
  uint8_t local_168 [4];
  int err;
  uint8_t full_tag [16];
  undefined1 local_150 [8];
  cf_ctr ctr;
  uint8_t e_Y0 [16];
  ghash_ctx gh;
  ghash_ctx gh_1;
  uint8_t Y0 [16];
  uint8_t H [16];
  size_t nheader_local;
  uint8_t *header_local;
  size_t ncipher_local;
  uint8_t *cipher_local;
  void *prpctx_local;
  cf_prp *prp_local;
  
  memset(Y0 + 8,0,0x10);
  (*prp->encrypt)(prpctx,Y0 + 8,Y0 + 8);
  if (nnonce == 0xc) {
    memcpy(&gh_1.state,nonce,0xc);
    Y0[6] = '\0';
    Y0[5] = '\0';
    Y0[4] = '\0';
    Y0[7] = '\x01';
  }
  else {
    ghash_init((ghash_ctx *)&gh.state,Y0 + 8);
    ghash_add_cipher((ghash_ctx *)&gh.state,nonce,nnonce);
    ghash_final((ghash_ctx *)&gh.state,(uint8_t *)&gh_1.state);
  }
  ghash_init((ghash_ctx *)(e_Y0 + 8),Y0 + 8);
  ghash_add_aad((ghash_ctx *)(e_Y0 + 8),header,nheader);
  memset(&ctr.counter_width,0,0x10);
  cf_ctr_init((cf_ctr *)local_150,prp,prpctx,(uint8_t *)&gh_1.state);
  cf_ctr_custom_counter((cf_ctr *)local_150,0xc,4);
  cf_ctr_cipher((cf_ctr *)local_150,(uint8_t *)&ctr.counter_width,(uint8_t *)&ctr.counter_width,0x10
               );
  ghash_add_cipher((ghash_ctx *)(e_Y0 + 8),cipher,ncipher);
  ghash_final((ghash_ctx *)(e_Y0 + 8),local_168);
  if ((1 < ntag) && (ntag < 0x11)) {
    xor_bb(local_168,local_168,(uint8_t *)&ctr.counter_width,ntag);
    uVar1 = mem_eq(local_168,tag,ntag);
    if (uVar1 != 0) {
      cf_ctr_cipher((cf_ctr *)local_150,cipher,plain,ncipher);
    }
    local_16c = (uint)(uVar1 == 0);
    mem_clean(Y0 + 8,0x10);
    mem_clean(&gh_1.state,0x10);
    mem_clean(&ctr.counter_width,0x10);
    mem_clean(local_168,0x10);
    mem_clean(e_Y0 + 8,0x50);
    mem_clean(local_150,0x48);
    return local_16c;
  }
  abort();
}

Assistant:

int cf_gcm_decrypt(const cf_prp *prp, void *prpctx,
                   const uint8_t *cipher, size_t ncipher,
                   const uint8_t *header, size_t nheader,
                   const uint8_t *nonce, size_t nnonce,
                   const uint8_t *tag, size_t ntag,
                   uint8_t *plain)
{
  uint8_t H[16] = { 0 };
  uint8_t Y0[16]; 

  /* H = E_K(0^128) */
  prp->encrypt(prpctx, H, H);

  /* Produce CTR nonce, Y_0:
   *
   * if len(IV) == 96
   *   Y_0 = IV || 0^31 || 1
   * otherwise
   *   Y_0 = GHASH(H, {}, IV)
   */

  if (nnonce == 12)
  {
    memcpy(Y0, nonce, nnonce);
    Y0[12] = Y0[13] = Y0[14] = 0x00;
    Y0[15] = 0x01;
  } else {
    ghash_ctx gh;
    ghash_init(&gh, H);
    ghash_add_cipher(&gh, nonce, nnonce);
    ghash_final(&gh, Y0);
  }
  
  /* Hash AAD. */
  ghash_ctx gh;
  ghash_init(&gh, H);
  ghash_add_aad(&gh, header, nheader);

  /* Start counter mode, to obtain offset on tag. */
  uint8_t e_Y0[16] = { 0 };
  cf_ctr ctr;
  cf_ctr_init(&ctr, prp, prpctx, Y0);
  cf_ctr_custom_counter(&ctr, 12, 4);
  cf_ctr_cipher(&ctr, e_Y0, e_Y0, sizeof e_Y0);

  /* Hash ciphertext. */
  ghash_add_cipher(&gh, cipher, ncipher);

  /* Produce tag. */
  uint8_t full_tag[16];
  ghash_final(&gh, full_tag);
  assert(ntag > 1 && ntag <= 16);
  xor_bb(full_tag, full_tag, e_Y0, ntag);

  int err = 1;
  if (!mem_eq(full_tag, tag, ntag))
    goto x_err;
  
  /* Complete decryption. */
  cf_ctr_cipher(&ctr, cipher, plain, ncipher);
  err = 0;
 
x_err:
  mem_clean(H, sizeof H);
  mem_clean(Y0, sizeof Y0);
  mem_clean(e_Y0, sizeof e_Y0);
  mem_clean(full_tag, sizeof full_tag);
  mem_clean(&gh, sizeof gh);
  mem_clean(&ctr, sizeof ctr);
  return err;
}